

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

bool __thiscall toml::internal::Parser::parseInlineTable(Parser *this,Value *value)

{
  bool bVar1;
  TokenType TVar2;
  Value *pVVar3;
  Value t;
  Value v;
  Value local_a8;
  undefined1 local_98 [32];
  _Base_ptr local_78;
  size_t local_70;
  Value local_68;
  Value *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->token_).type_ == LBRACE) {
    local_58 = value;
    nextKey(this);
    local_98._24_8_ = local_98 + 8;
    local_98._16_8_ = (_Base_ptr)0x0;
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = 0;
    local_70 = 0;
    local_a8.type_ = TABLE_TYPE;
    local_78 = (_Base_ptr)local_98._24_8_;
    local_a8.field_1.null_ = operator_new(0x30);
    (((_Rep_type *)
     &(local_a8.field_1.array_)->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)->
    _M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    *(_Rb_tree_header **)((long)&(local_a8.field_1.string_)->field_2 + 8) =
         (_Rb_tree_header *)&(local_a8.field_1.string_)->_M_string_length;
    ((local_a8.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)&(local_a8.field_1.string_)->_M_string_length;
    ((local_a8.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    (((_Rb_tree_header *)&(local_a8.field_1.string_)->_M_string_length)->_M_header)._M_color =
         _S_red;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                 *)local_98);
    TVar2 = (this->token_).type_;
    if (TVar2 != RBRACE) {
      bVar1 = true;
      do {
        if (!bVar1) {
          if (TVar2 == COMMA) {
            nextKey(this);
            TVar2 = (this->token_).type_;
            goto LAB_00136067;
          }
          local_98._0_8_ = local_98 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,"inline table didn\'t have \',\' for delimiter?","");
          addError(this,(string *)local_98);
LAB_001361a7:
          if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
            operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
          }
LAB_001361c3:
          bVar1 = false;
          goto LAB_001361c5;
        }
LAB_00136067:
        local_98._0_8_ = local_98 + 0x10;
        local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
        local_98._8_8_ = 0;
        if (1 < TVar2 - IDENT) goto LAB_001361c3;
        std::__cxx11::string::_M_assign((string *)local_98);
        nextValue(this);
        if ((this->token_).type_ != EQUAL) goto LAB_001361a7;
        nextValue(this);
        local_68.type_ = NULL_TYPE;
        local_68.field_1.null_ = (void *)0x0;
        bVar1 = parseValue(this,&local_68);
        if (!bVar1) {
LAB_0013616e:
          Value::~Value(&local_68);
          goto LAB_001361a7;
        }
        pVVar3 = Value::find(&local_a8,(string *)local_98);
        if (pVVar3 != (Value *)0x0) {
          std::operator+(&local_50,"inline table has multiple same keys: key=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98);
          addError(this,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0013616e;
        }
        pVVar3 = Value::ensureValue(&local_a8,(string *)local_98);
        Value::operator=(pVVar3,&local_68);
        Value::~Value(&local_68);
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
        }
        TVar2 = (this->token_).type_;
        bVar1 = false;
      } while (TVar2 != RBRACE);
    }
    nextValue(this);
    pVVar3 = local_58;
    bVar1 = true;
    if (&local_a8 != local_58) {
      Value::~Value(local_58);
      pVVar3->type_ = local_a8.type_;
      switch(local_a8.type_) {
      case NULL_TYPE:
      case INT_TYPE:
      case STRING_TYPE:
      case TIME_TYPE:
      case ARRAY_TYPE:
      case TABLE_TYPE:
        (pVVar3->field_1).table_ = (Table *)local_a8.field_1;
        break;
      case BOOL_TYPE:
        (pVVar3->field_1).bool_ = local_a8.field_1.bool_;
        break;
      case DOUBLE_TYPE:
        (pVVar3->field_1).table_ = (Table *)local_a8.field_1;
        break;
      default:
        pVVar3->type_ = NULL_TYPE;
        (pVVar3->field_1).null_ = (void *)0x0;
      }
      local_a8.type_ = NULL_TYPE;
      local_a8.field_1.null_ = (Table *)0x0;
    }
LAB_001361c5:
    Value::~Value(&local_a8);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool Parser::consumeForKey(TokenType type)
{
    if (token().type() == type) {
        nextKey();
        return true;
    }

    return false;
}